

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O1

LY_ERR lys_parse_load(ly_ctx *ctx,char *name,char *revision,ly_set *new_mods,lys_module **mod)

{
  int iVar1;
  LY_ERR LVar2;
  lys_module *plVar3;
  lys_module *plVar4;
  bool bVar5;
  LYS_INFORMAT format;
  char *module_data;
  char *local_78;
  ly_set *local_70;
  ly_in *local_68;
  _func_void_void_ptr_void_ptr *module_data_free;
  lysp_load_module_check_data check_data;
  
  local_70 = new_mods;
  if ((new_mods == (ly_set *)0x0) || (mod == (lys_module **)0x0)) {
    __assert_fail("mod && new_mods",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_common.c"
                  ,0x3b8,
                  "LY_ERR lys_parse_load(struct ly_ctx *, const char *, const char *, struct ly_set *, struct lys_module **)"
                 );
  }
  if (revision == (char *)0x0) {
    check_data.name = (char *)((ulong)check_data.name & 0xffffffff00000000);
    local_78 = revision;
    plVar4 = ly_ctx_get_module_iter(ctx,(uint32_t *)&check_data);
    bVar5 = plVar4 == (lys_module *)0x0;
    if (!bVar5) {
      do {
        iVar1 = strcmp(plVar4->name,name);
        if ((iVar1 == 0) && ((plVar4->latest_revision & 4) != 0)) break;
        plVar4 = ly_ctx_get_module_iter(ctx,(uint32_t *)&check_data);
        bVar5 = plVar4 == (lys_module *)0x0;
      } while (!bVar5);
    }
    plVar3 = ly_ctx_get_module_implemented(ctx,name);
    revision = local_78;
    if (bVar5) {
      plVar4 = plVar3;
      if (plVar3 == (lys_module *)0x0) {
        plVar4 = ly_ctx_get_module_latest(ctx,name);
      }
    }
    else if (plVar4 != plVar3 && plVar3 != (lys_module *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
             "Implemented module \"%s@%s\" is not used for import, revision \"%s\" is imported instead."
             ,plVar3->name,plVar3->revision,plVar4->revision);
    }
    *mod = plVar4;
    if ((plVar4 == (lys_module *)0x0) || (plVar4->implemented != '\0')) {
      plVar3 = (lys_module *)0x0;
      goto LAB_00163448;
    }
    plVar3 = (lys_module *)0x0;
    if ((plVar4->latest_revision & 4) != 0) goto LAB_00163448;
  }
  else {
    plVar3 = ly_ctx_get_module(ctx,name,revision);
    plVar4 = (lys_module *)0x0;
  }
  *mod = plVar3;
  plVar3 = plVar4;
LAB_00163448:
  if (*mod == (lys_module *)0x0) {
    module_data = (char *)0x0;
    format = LYS_IN_UNKNOWN;
    module_data_free = (_func_void_void_ptr_void_ptr *)0x0;
    check_data.path = (char *)0x0;
    check_data.submoduleof = (char *)0x0;
    check_data.name = (char *)0x0;
    check_data.revision = (char *)0x0;
    *mod = (lys_module *)0x0;
    if (((plVar3 == (lys_module *)0x0) ||
        ((ctx->imp_clb != (ly_module_imp_clb)0x0 && ((plVar3->latest_revision & 8) == 0)))) ||
       ((LVar2 = LY_SUCCESS, (ctx->flags & 8) == 0 && ((plVar3->latest_revision & 2) == 0)))) {
      if ((ctx->flags & 0x20) == 0) goto LAB_00163521;
      while( true ) {
        if (((ctx->flags & 8) == 0) &&
           ((plVar3 == (lys_module *)0x0 || ((plVar3->latest_revision & 2) == 0)))) {
          lys_parse_localfile(ctx,name,revision,(lysp_ctx *)0x0,(char *)0x0,
                              plVar3 == (lys_module *)0x0,local_70,mod);
        }
        plVar4 = *mod;
        if (revision == (char *)0x0 && plVar4 != (lys_module *)0x0) break;
        LVar2 = LY_SUCCESS;
        if ((plVar4 != (lys_module *)0x0) || ((ctx->flags & 0x20) == 0)) goto LAB_00163665;
LAB_00163521:
        if ((ctx->imp_clb != (ly_module_imp_clb)0x0) &&
           (((plVar3 == (lys_module *)0x0 || ((plVar3->latest_revision & 8) == 0)) &&
            (LVar2 = (*ctx->imp_clb)(name,revision,(char *)0x0,(char *)0x0,ctx->imp_clb_data,&format
                                     ,&module_data,&module_data_free), LVar2 == LY_SUCCESS)))) {
          LVar2 = ly_in_new_memory(module_data,&local_68);
          if (LVar2 != LY_SUCCESS) goto LAB_00163665;
          check_data.name = name;
          check_data.revision = revision;
          lys_parse_in(ctx,local_68,format,lysp_load_module_check,&check_data,local_70,mod);
          ly_in_free(local_68,'\0');
          if (module_data_free != (_func_void_void_ptr_void_ptr *)0x0) {
            (*module_data_free)(module_data,ctx->imp_clb_data);
          }
        }
        plVar4 = *mod;
        if (revision == (char *)0x0 && plVar4 != (lys_module *)0x0) break;
        LVar2 = LY_SUCCESS;
        if ((plVar4 != (lys_module *)0x0) || ((ctx->flags & 0x20) != 0)) goto LAB_00163665;
      }
      plVar4->latest_revision = plVar4->latest_revision | 8;
      LVar2 = LY_SUCCESS;
    }
LAB_00163665:
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    plVar4 = *mod;
    if (plVar3 == (lys_module *)0x0 && plVar4 == (lys_module *)0x0) {
      ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"Loading \"%s\" module failed.",name);
      return LY_EVALID;
    }
    if (plVar4 == (lys_module *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
             "Newer revision than \"%s@%s\" not found, using this as the latest revision.",
             plVar3->name,plVar3->revision);
      if ((plVar3->latest_revision & 1) == 0) {
        __assert_fail("mod_latest->latest_revision & LYS_MOD_LATEST_REV",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_common.c"
                      ,0x3da,
                      "LY_ERR lys_parse_load(struct ly_ctx *, const char *, const char *, struct ly_set *, struct lys_module **)"
                     );
      }
      plVar3->latest_revision = plVar3->latest_revision | 2;
      *mod = plVar3;
    }
    else if ((revision == (char *)0x0) && ((plVar4->latest_revision & 1) != 0)) {
      plVar4->latest_revision = plVar4->latest_revision | 2;
    }
  }
  plVar4 = *mod;
  if (plVar4 == (lys_module *)0x0) {
    return LY_SUCCESS;
  }
  if ((plVar4->parsed->field_0x79 & 1) != 0) {
    ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"A circular dependency (import) for module \"%s\".",
            plVar4->name);
    *mod = (lys_module *)0x0;
    return LY_EVALID;
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lys_parse_load(struct ly_ctx *ctx, const char *name, const char *revision, struct ly_set *new_mods,
        struct lys_module **mod)
{
    struct lys_module *mod_latest = NULL;

    assert(mod && new_mods);

    /*
     * Try to get the module from the context.
     */
    if (revision) {
        /* Get the specific revision. */
        *mod = ly_ctx_get_module(ctx, name, revision);
    } else {
        /* Get the requested module in a suitable revision in the context. */
        *mod = lys_get_module_without_revision(ctx, name);
        if (*mod && !(*mod)->implemented && !((*mod)->latest_revision & LYS_MOD_IMPORTED_REV)) {
            /* Let us now search with callback and searchpaths to check
             * if there is newer revision outside the context.
             */
            mod_latest = *mod;
            *mod = NULL;
        }
    }

    if (!*mod) {
        /* No suitable module in the context, try to load it. */
        LY_CHECK_RET(lys_parse_load_from_clb_or_file(ctx, name, revision, mod_latest, new_mods, mod));
        if (!*mod && !mod_latest) {
            LOGVAL(ctx, LYVE_REFERENCE, "Loading \"%s\" module failed.", name);
            return LY_EVALID;
        }

        /* Update the latest_revision flag - here we have selected the latest available schema,
         * consider that even the callback provides correct latest revision.
         */
        if (!*mod) {
            LOGVRB("Newer revision than \"%s@%s\" not found, using this as the latest revision.",
                    mod_latest->name, mod_latest->revision);
            assert(mod_latest->latest_revision & LYS_MOD_LATEST_REV);
            mod_latest->latest_revision |= LYS_MOD_LATEST_SEARCHDIRS;
            *mod = mod_latest;
        } else if (*mod && !revision && ((*mod)->latest_revision & LYS_MOD_LATEST_REV)) {
            (*mod)->latest_revision |= LYS_MOD_LATEST_SEARCHDIRS;
        }
    }

    /* Checking the circular dependence of imported modules. */
    LY_CHECK_RET(lys_check_circular_dependency(ctx, mod));

    return LY_SUCCESS;
}